

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O3

bool __thiscall
draco::PlyDecoder::ReadPropertiesToAttribute<int>
          (PlyDecoder *this,
          vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          *properties,PointAttribute *attribute,int num_vertices)

{
  size_t __n;
  int iVar1;
  PlyPropertyReader<int> *pPVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  size_type __n_00;
  ulong uVar6;
  pointer ppPVar7;
  vector<int,_std::allocator<int>_> memory;
  vector<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  readers;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  uint local_4c;
  vector<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = num_vertices;
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ::reserve(&local_48,
            (long)(properties->
                  super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(properties->
                  super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppPVar7 = (properties->
            super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((properties->
      super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>).
      _M_impl.super__Vector_impl_data._M_finish == ppPVar7) {
    __n_00 = 0;
  }
  else {
    uVar4 = 0;
    do {
      pPVar2 = (PlyPropertyReader<int> *)operator_new(0x28);
      PlyPropertyReader<int>::PlyPropertyReader(pPVar2,ppPVar7[uVar4]);
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pPVar2;
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>>>
      ::
      emplace_back<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>>
                ((vector<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,std::default_delete<draco::PlyPropertyReader<int>>>>>
                  *)&local_48,
                 (unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>
                  *)&local_68);
      if ((PlyPropertyReader<int> *)
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (PlyPropertyReader<int> *)0x0) {
        std::default_delete<draco::PlyPropertyReader<int>_>::operator()
                  ((default_delete<draco::PlyPropertyReader<int>_> *)&local_68,
                   (PlyPropertyReader<int> *)
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
      }
      uVar4 = uVar4 + 1;
      ppPVar7 = (properties->
                super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __n_00 = (long)(properties->
                     super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar7 >> 3;
    } while (uVar4 < __n_00);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__n_00,(allocator_type *)&local_6c);
  if (local_4c != 0) {
    uVar4 = (ulong)local_4c;
    uVar6 = 0;
    do {
      if ((properties->
          super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (properties->
          super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        uVar5 = 0;
        do {
          pPVar2 = local_48.
                   super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
                   super___uniq_ptr_impl<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::PlyPropertyReader<int>_*,_std::default_delete<draco::PlyPropertyReader<int>_>_>
                   .super__Head_base<0UL,_draco::PlyPropertyReader<int>_*,_false>._M_head_impl;
          local_6c = (int)uVar6;
          if (*(_Manager_type *)((long)&(pPVar2->convert_value_func_).super__Function_base + 0x10)
              == (_Manager_type)0x0) {
            uVar3 = std::__throw_bad_function_call();
            std::
            vector<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
            ::~vector(&local_48);
            _Unwind_Resume(uVar3);
          }
          iVar1 = (*(pPVar2->convert_value_func_)._M_invoker)
                            ((_Any_data *)&pPVar2->convert_value_func_,&local_6c);
          *(int *)((long)(PlyProperty **)
                         local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar5 * 4) = iVar1;
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)(properties->
                                       super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(properties->
                                       super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      __n = (attribute->super_GeometryAttribute).byte_stride_;
      memcpy((void *)(__n * uVar6 +
                     (long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start),
             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,__n);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar4);
  }
  if ((PlyPropertyReader<int> *)
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (PlyPropertyReader<int> *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<int>,_std::default_delete<draco::PlyPropertyReader<int>_>_>_>_>
  ::~vector(&local_48);
  return true;
}

Assistant:

bool PlyDecoder::ReadPropertiesToAttribute(
    const std::vector<const PlyProperty *> &properties,
    PointAttribute *attribute, int num_vertices) {
  std::vector<std::unique_ptr<PlyPropertyReader<DataTypeT>>> readers;
  readers.reserve(properties.size());
  for (int prop = 0; prop < properties.size(); ++prop) {
    readers.push_back(std::unique_ptr<PlyPropertyReader<DataTypeT>>(
        new PlyPropertyReader<DataTypeT>(properties[prop])));
  }
  std::vector<DataTypeT> memory(properties.size());
  for (PointIndex::ValueType i = 0; i < static_cast<uint32_t>(num_vertices);
       ++i) {
    for (int prop = 0; prop < properties.size(); ++prop) {
      memory[prop] = readers[prop]->ReadValue(i);
    }
    attribute->SetAttributeValue(AttributeValueIndex(i), memory.data());
  }
  return true;
}